

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::ListFileScope::ListFileScope(ListFileScope *this,cmMakefile *mf,string *filenametoread)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmStateSnapshot local_a8;
  cmListFileContext local_90;
  
  this->Makefile = mf;
  this->ReportError = true;
  cmListFileContext::FromListFilePath(&local_90,filenametoread);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_a8,
             (cmListFileContext *)&mf->Backtrace);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&this->Makefile->Backtrace,
              (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.Position);
  cmListFileContext::~cmListFileContext(&local_90);
  cmState::CreateInlineListFileSnapshot
            (&local_a8,
             (this->Makefile->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&this->Makefile->StateSnapshot,
             filenametoread);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_a8.Position.Position;
  (pcVar1->StateSnapshot).State = local_a8.State;
  (pcVar1->StateSnapshot).Position.Tree = local_a8.Position.Tree;
  bVar2 = cmStateSnapshot::IsValid(&this->Makefile->StateSnapshot);
  if (bVar2) {
    PushFunctionBlockerBarrier(this->Makefile);
    return;
  }
  __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                ,0x28d,"cmMakefile::ListFileScope::ListFileScope(cmMakefile *, const std::string &)"
               );
}

Assistant:

ListFileScope(cmMakefile* mf, std::string const& filenametoread)
    : Makefile(mf)
  {
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(
      cmListFileContext::FromListFilePath(filenametoread));

    this->Makefile->StateSnapshot =
      this->Makefile->GetState()->CreateInlineListFileSnapshot(
        this->Makefile->StateSnapshot, filenametoread);
    assert(this->Makefile->StateSnapshot.IsValid());

    this->Makefile->PushFunctionBlockerBarrier();
  }